

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_mark.cpp
# Opt level: O1

Read<signed_char> __thiscall
Omega_h::mark_down(Omega_h *this,Mesh *mesh,Int high_dim,Int low_dim,Read<signed_char> *high_marked)

{
  int *piVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  Alloc *pAVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  undefined8 uVar5;
  undefined4 in_register_00000014;
  void *pvVar6;
  void *extraout_RDX;
  char *pcVar7;
  bool bVar8;
  Read<signed_char> RVar9;
  Adj l2h;
  long *local_b8;
  element_type *peStack_b0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a8 [2];
  Alloc *local_98;
  LO local_90 [2];
  Read<signed_char> local_88;
  Graph local_78;
  Adj local_58;
  
  if (low_dim < 0) {
    pcVar7 = "0 <= low_dim";
    uVar5 = 0x24;
  }
  else if (high_dim < low_dim) {
    pcVar7 = "low_dim <= high_dim";
    uVar5 = 0x25;
  }
  else {
    if (high_dim < 4) {
      if (high_dim == low_dim) {
        pAVar3 = (high_marked->write_).shared_alloc_.alloc;
        *(Alloc **)this = pAVar3;
        *(void **)(this + 8) = (high_marked->write_).shared_alloc_.direct_ptr;
        bVar8 = ((ulong)pAVar3 & 7) != 0;
        pvVar6 = (void *)CONCAT71((int7)(CONCAT44(in_register_00000014,high_dim) >> 8),
                                  bVar8 || pAVar3 == (Alloc *)0x0);
        if ((!bVar8 && pAVar3 != (Alloc *)0x0) && (entering_parallel == '\x01')) {
          pAVar3->use_count = pAVar3->use_count + -1;
          *(size_t *)this = pAVar3->size * 8 + 1;
        }
        (high_marked->write_).shared_alloc_.alloc = (Alloc *)0x0;
        (high_marked->write_).shared_alloc_.direct_ptr = (void *)0x0;
      }
      else {
        Mesh::ask_up(&local_58,mesh,low_dim,high_dim);
        local_78.a2ab.write_.shared_alloc_.alloc =
             local_58.super_Graph.a2ab.write_.shared_alloc_.alloc;
        if (((ulong)local_58.super_Graph.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
            local_58.super_Graph.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_78.a2ab.write_.shared_alloc_.alloc =
                 (Alloc *)((local_58.super_Graph.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1);
          }
          else {
            (local_58.super_Graph.a2ab.write_.shared_alloc_.alloc)->use_count =
                 (local_58.super_Graph.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
          }
        }
        local_78.a2ab.write_.shared_alloc_.direct_ptr =
             local_58.super_Graph.a2ab.write_.shared_alloc_.direct_ptr;
        local_78.ab2b.write_.shared_alloc_.alloc =
             local_58.super_Graph.ab2b.write_.shared_alloc_.alloc;
        if (((ulong)local_58.super_Graph.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
            local_58.super_Graph.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_78.ab2b.write_.shared_alloc_.alloc =
                 (Alloc *)((local_58.super_Graph.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1);
          }
          else {
            (local_58.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count =
                 (local_58.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
          }
        }
        local_78.ab2b.write_.shared_alloc_.direct_ptr =
             local_58.super_Graph.ab2b.write_.shared_alloc_.direct_ptr;
        local_88.write_.shared_alloc_.alloc = (high_marked->write_).shared_alloc_.alloc;
        if (((ulong)local_88.write_.shared_alloc_.alloc & 7) == 0 &&
            local_88.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_88.write_.shared_alloc_.alloc =
                 (Alloc *)((local_88.write_.shared_alloc_.alloc)->size * 8 + 1);
          }
          else {
            (local_88.write_.shared_alloc_.alloc)->use_count =
                 (local_88.write_.shared_alloc_.alloc)->use_count + 1;
          }
        }
        local_88.write_.shared_alloc_.direct_ptr = (high_marked->write_).shared_alloc_.direct_ptr;
        mark_down(this,&local_78,&local_88);
        pAVar3 = local_88.write_.shared_alloc_.alloc;
        if (((ulong)local_88.write_.shared_alloc_.alloc & 7) == 0 &&
            local_88.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          piVar1 = &(local_88.write_.shared_alloc_.alloc)->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_88.write_.shared_alloc_.alloc);
            operator_delete(pAVar3,0x48);
          }
        }
        pAVar3 = local_78.ab2b.write_.shared_alloc_.alloc;
        if (((ulong)local_78.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
            local_78.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          piVar1 = &(local_78.ab2b.write_.shared_alloc_.alloc)->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_78.ab2b.write_.shared_alloc_.alloc);
            operator_delete(pAVar3,0x48);
          }
        }
        pAVar3 = local_78.a2ab.write_.shared_alloc_.alloc;
        if (((ulong)local_78.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
            local_78.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          piVar1 = &(local_78.a2ab.write_.shared_alloc_.alloc)->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_78.a2ab.write_.shared_alloc_.alloc);
            operator_delete(pAVar3,0x48);
          }
        }
        bVar8 = Mesh::owners_have_all_upward(mesh,low_dim);
        if (!bVar8) {
          local_98 = *(Alloc **)this;
          if (((ulong)local_98 & 7) == 0 && local_98 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_98 = (Alloc *)(local_98->size * 8 + 1);
            }
            else {
              local_98->use_count = local_98->use_count + 1;
            }
          }
          local_90 = *(LO (*) [2])(this + 8);
          Mesh::reduce_array<signed_char>
                    ((Mesh *)&local_b8,(Int)mesh,(Read<signed_char> *)(ulong)(uint)low_dim,
                     (Int)&local_98,OMEGA_H_MAX);
          pAVar3 = *(Alloc **)this;
          if (((ulong)pAVar3 & 7) == 0 && pAVar3 != (Alloc *)0x0) {
            piVar1 = &pAVar3->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(pAVar3);
              operator_delete(pAVar3,0x48);
            }
          }
          pAVar3 = local_98;
          *(long **)this = local_b8;
          *(element_type **)(this + 8) = peStack_b0;
          if ((((ulong)local_b8 & 7) == 0 && local_b8 != (long *)0x0) &&
             (entering_parallel == '\x01')) {
            *(int *)(local_b8 + 6) = (int)local_b8[6] + -1;
            *(long *)this = *local_b8 * 8 + 1;
          }
          local_b8 = (long *)0x0;
          peStack_b0 = (element_type *)0x0;
          if (((ulong)local_98 & 7) == 0 && local_98 != (Alloc *)0x0) {
            piVar1 = &local_98->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_98);
              operator_delete(pAVar3,0x48);
            }
          }
        }
        local_a8[0]._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)this;
        if (((ulong)local_a8[0]._M_pi & 7) == 0 && (Alloc *)local_a8[0]._M_pi != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_a8[0]._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 (((Alloc *)local_a8[0]._M_pi)->size * 8 + 1);
          }
          else {
            ((Alloc *)local_a8[0]._M_pi)->use_count = ((Alloc *)local_a8[0]._M_pi)->use_count + 1;
          }
        }
        local_a8[1]._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8);
        Mesh::sync_array<signed_char>
                  ((Mesh *)&local_b8,(Int)mesh,(Read<signed_char> *)(ulong)(uint)low_dim,
                   (Int)local_a8);
        pAVar3 = *(Alloc **)this;
        if (((ulong)pAVar3 & 7) == 0 && pAVar3 != (Alloc *)0x0) {
          piVar1 = &pAVar3->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(pAVar3);
            operator_delete(pAVar3,0x48);
          }
        }
        _Var4._M_pi = local_a8[0]._M_pi;
        *(long **)this = local_b8;
        *(element_type **)(this + 8) = peStack_b0;
        if ((((ulong)local_b8 & 7) == 0 && local_b8 != (long *)0x0) && (entering_parallel == '\x01')
           ) {
          *(int *)(local_b8 + 6) = (int)local_b8[6] + -1;
          *(long *)this = *local_b8 * 8 + 1;
        }
        local_b8 = (long *)0x0;
        peStack_b0 = (element_type *)0x0;
        if (((ulong)local_a8[0]._M_pi & 7) == 0 && (Alloc *)local_a8[0]._M_pi != (Alloc *)0x0) {
          p_Var2 = local_a8[0]._M_pi + 3;
          *(int *)&p_Var2->_vptr__Sp_counted_base = *(int *)&p_Var2->_vptr__Sp_counted_base + -1;
          if (*(int *)&p_Var2->_vptr__Sp_counted_base == 0) {
            Alloc::~Alloc((Alloc *)local_a8[0]._M_pi);
            operator_delete(_Var4._M_pi,0x48);
          }
        }
        Adj::~Adj(&local_58);
        pvVar6 = extraout_RDX;
      }
      RVar9.write_.shared_alloc_.direct_ptr = pvVar6;
      RVar9.write_.shared_alloc_.alloc = (Alloc *)this;
      return (Read<signed_char>)RVar9.write_.shared_alloc_;
    }
    pcVar7 = "high_dim <= 3";
    uVar5 = 0x26;
  }
  fail("assertion %s failed at %s +%d\n",pcVar7,
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mark.cpp"
       ,uVar5);
}

Assistant:

Read<I8> mark_down(
    Mesh* mesh, Int high_dim, Int low_dim, Read<I8> high_marked) {
  OMEGA_H_CHECK(0 <= low_dim);
  OMEGA_H_CHECK(low_dim <= high_dim);
  OMEGA_H_CHECK(high_dim <= 3);
  if (high_dim == low_dim) return high_marked;
  auto l2h = mesh->ask_up(low_dim, high_dim);
  auto low_marks = mark_down(l2h, high_marked);
  if (!mesh->owners_have_all_upward(low_dim)) {
    low_marks = mesh->reduce_array(low_dim, low_marks, 1, OMEGA_H_MAX);
  }
  low_marks = mesh->sync_array(low_dim, low_marks, 1);
  return low_marks;
}